

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplatedCustomNamer.cpp
# Opt level: O0

Path * __thiscall
ApprovalTests::TemplatedCustomNamer::getReceivedFileAsPath
          (TemplatedCustomNamer *this,string *extensionWithDot)

{
  Path *in_RDI;
  string *in_stack_00000518;
  string *in_stack_00000520;
  TemplatedCustomNamer *in_stack_00000528;
  allocator local_39;
  string local_38 [56];
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,"received",&local_39);
  constructFromTemplate(in_stack_00000528,in_stack_00000520,in_stack_00000518);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return in_RDI;
}

Assistant:

Path TemplatedCustomNamer::getReceivedFileAsPath(std::string extensionWithDot) const
    {
        return constructFromTemplate(extensionWithDot, "received");
    }